

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_minnow_byt_compatible.c
# Opt level: O3

mraa_board_t * mraa_intel_minnowboard_byt_compatible(mraa_boolean_t turbot)

{
  int iVar1;
  mraa_result_t mVar2;
  mraa_board_t *board;
  mraa_pininfo_t *pmVar3;
  mraa_adv_func_t *pmVar4;
  char *pcVar5;
  uint uVar6;
  int pin_index_scl;
  int pin_index_sda;
  int uname_minor;
  int uname_major;
  utsname running_uname;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  utsname local_19e;
  
  board = (mraa_board_t *)calloc(1,0x5f0);
  if (board != (mraa_board_t *)0x0) {
    board->platform_name = "MinnowBoard MAX";
    pcVar5 = "Turbot";
    if (turbot == 0) {
      pcVar5 = "Ax";
    }
    uVar6 = (turbot != 0) + 0x1b;
    board->platform_version = pcVar5;
    board->phy_pin_count = uVar6;
    board->gpio_count = uVar6;
    board->chardev_capable = 1;
    pmVar3 = (mraa_pininfo_t *)calloc((ulong)uVar6,0x2f4);
    board->pins = pmVar3;
    if (pmVar3 != (mraa_pininfo_t *)0x0) {
      pmVar4 = (mraa_adv_func_t *)calloc(1,0x288);
      board->adv_func = pmVar4;
      if (pmVar4 != (mraa_adv_func_t *)0x0) {
        iVar1 = uname(&local_19e);
        if (iVar1 == 0) {
          __isoc99_sscanf(local_19e.release,"%d.%d",&local_1a4,&local_1a8);
          if ((local_1a4 < 4) && (local_1a8 < 0x12)) {
            arch_nr_gpios_adjust = 0;
          }
          if (0 < board->phy_pin_count) {
            pmVar3 = board->pins;
            builtin_strncpy(pmVar3->name,"INVALID",8);
            *(undefined1 *)&pmVar3->capabilities = 0;
            (pmVar3->capabilities).field_0x3 = 0;
            *(undefined2 *)&(pmVar3->capabilities).field_0x1 = 0;
            if (1 < board->phy_pin_count) {
              pmVar3 = board->pins;
              pmVar3[1].name[0] = 'G';
              pmVar3[1].name[1] = 'N';
              pmVar3[1].name[2] = 'D';
              pmVar3[1].name[3] = '\0';
              pmVar3[1].name[4] = '\0';
              pmVar3[1].name[5] = '\0';
              pmVar3[1].name[6] = '\0';
              pmVar3[1].name[7] = '\0';
              *(undefined1 *)&pmVar3[1].capabilities = 0;
              pmVar3[1].capabilities.field_0x3 = 0;
              *(undefined2 *)&pmVar3[1].capabilities.field_0x1 = 0;
              if (2 < board->phy_pin_count) {
                pmVar3 = board->pins;
                pmVar3[2].name[0] = 'G';
                pmVar3[2].name[1] = 'N';
                pmVar3[2].name[2] = 'D';
                pmVar3[2].name[3] = '\0';
                pmVar3[2].name[4] = '\0';
                pmVar3[2].name[5] = '\0';
                pmVar3[2].name[6] = '\0';
                pmVar3[2].name[7] = '\0';
                *(undefined1 *)&pmVar3[2].capabilities = 0;
                pmVar3[2].capabilities.field_0x3 = 0;
                *(undefined2 *)&pmVar3[2].capabilities.field_0x1 = 0;
                if (3 < board->phy_pin_count) {
                  pmVar3 = board->pins;
                  pmVar3[3].name[0] = '5';
                  pmVar3[3].name[1] = 'v';
                  pmVar3[3].name[2] = '\0';
                  pmVar3[3].name[3] = '\0';
                  pmVar3[3].name[4] = '\0';
                  pmVar3[3].name[5] = '\0';
                  pmVar3[3].name[6] = '\0';
                  pmVar3[3].name[7] = '\0';
                  *(undefined1 *)&pmVar3[3].capabilities = 0;
                  pmVar3[3].capabilities.field_0x3 = 0;
                  *(undefined2 *)&pmVar3[3].capabilities.field_0x1 = 0;
                  if (4 < board->phy_pin_count) {
                    pmVar3 = board->pins;
                    pmVar3[4].name[0] = '3';
                    pmVar3[4].name[1] = '.';
                    pmVar3[4].name[2] = '3';
                    pmVar3[4].name[3] = 'v';
                    pmVar3[4].name[4] = '\0';
                    pmVar3[4].name[5] = '\0';
                    pmVar3[4].name[6] = '\0';
                    pmVar3[4].name[7] = '\0';
                    *(undefined1 *)&pmVar3[4].capabilities = 0;
                    pmVar3[4].capabilities.field_0x3 = 0;
                    *(undefined2 *)&pmVar3[4].capabilities.field_0x1 = 0;
                    if (5 < board->phy_pin_count) {
                      pmVar3 = board->pins;
                      pmVar3[5].name[0] = 'S';
                      pmVar3[5].name[1] = 'P';
                      pmVar3[5].name[2] = 'I';
                      pmVar3[5].name[3] = '_';
                      pmVar3[5].name[4] = 'C';
                      pmVar3[5].name[5] = 'S';
                      pmVar3[5].name[6] = '\0';
                      pmVar3[5].name[7] = '\0';
                      *(undefined1 *)&pmVar3[5].capabilities = 0x11;
                      pmVar3[5].capabilities.field_0x3 = 0;
                      *(undefined2 *)&pmVar3[5].capabilities.field_0x1 = 0;
                      pmVar3[5].spi.mux_total = 0;
                      if (6 < board->phy_pin_count) {
                        pmVar3 = board->pins;
                        pmVar3[6].name[0] = 'U';
                        pmVar3[6].name[1] = 'A';
                        pmVar3[6].name[2] = 'R';
                        pmVar3[6].name[3] = 'T';
                        pmVar3[6].name[4] = '1';
                        pmVar3[6].name[5] = 'T';
                        pmVar3[6].name[6] = 'X';
                        pmVar3[6].name[7] = '\0';
                        *(undefined1 *)&pmVar3[6].capabilities = 0x81;
                        pmVar3[6].capabilities.field_0x3 = 0;
                        *(undefined2 *)&pmVar3[6].capabilities.field_0x1 = 0;
                        if (7 < board->phy_pin_count) {
                          pmVar3 = board->pins;
                          pmVar3[7].name[0] = 'S';
                          pmVar3[7].name[1] = 'P';
                          pmVar3[7].name[2] = 'I';
                          pmVar3[7].name[3] = 'M';
                          pmVar3[7].name[4] = 'I';
                          pmVar3[7].name[5] = 'S';
                          pmVar3[7].name[6] = 'O';
                          pmVar3[7].name[7] = '\0';
                          *(undefined1 *)&pmVar3[7].capabilities = 0x11;
                          pmVar3[7].capabilities.field_0x3 = 0;
                          *(undefined2 *)&pmVar3[7].capabilities.field_0x1 = 0;
                          pmVar3[7].spi.mux_total = 0;
                          if (8 < board->phy_pin_count) {
                            pmVar3 = board->pins;
                            pmVar3[8].name[0] = 'U';
                            pmVar3[8].name[1] = 'A';
                            pmVar3[8].name[2] = 'R';
                            pmVar3[8].name[3] = 'T';
                            pmVar3[8].name[4] = '1';
                            pmVar3[8].name[5] = 'R';
                            pmVar3[8].name[6] = 'X';
                            pmVar3[8].name[7] = '\0';
                            *(undefined1 *)&pmVar3[8].capabilities = 0x81;
                            pmVar3[8].capabilities.field_0x3 = 0;
                            *(undefined2 *)&pmVar3[8].capabilities.field_0x1 = 0;
                            if (9 < board->phy_pin_count) {
                              pmVar3 = board->pins;
                              pmVar3[9].name[0] = 'S';
                              pmVar3[9].name[1] = 'P';
                              pmVar3[9].name[2] = 'I';
                              pmVar3[9].name[3] = 'M';
                              pmVar3[9].name[4] = 'O';
                              pmVar3[9].name[5] = 'S';
                              pmVar3[9].name[6] = 'I';
                              pmVar3[9].name[7] = '\0';
                              *(undefined1 *)&pmVar3[9].capabilities = 0x11;
                              pmVar3[9].capabilities.field_0x3 = 0;
                              *(undefined2 *)&pmVar3[9].capabilities.field_0x1 = 0;
                              pmVar3[9].spi.mux_total = 0;
                              if (10 < board->phy_pin_count) {
                                pmVar3 = board->pins;
                                pmVar3[10].name[0] = 'U';
                                pmVar3[10].name[1] = 'A';
                                pmVar3[10].name[2] = 'R';
                                pmVar3[10].name[3] = 'T';
                                pmVar3[10].name[4] = '1';
                                pmVar3[10].name[5] = 'C';
                                pmVar3[10].name[6] = 'T';
                                pmVar3[10].name[7] = '\0';
                                *(undefined1 *)&pmVar3[10].capabilities = 3;
                                pmVar3[10].capabilities.field_0x3 = 0;
                                *(undefined2 *)&pmVar3[10].capabilities.field_0x1 = 0;
                                iVar1 = arch_nr_gpios_adjust;
                                pmVar3[10].gpio.pinmap = arch_nr_gpios_adjust | 0xe3;
                                pmVar3[10].gpio.mux_total = 0;
                                pmVar3[10].gpio.gpio_chip = 0;
                                pmVar3[10].gpio.gpio_line = 0x49;
                                if (0xb < board->phy_pin_count) {
                                  pmVar3 = board->pins;
                                  pmVar3[0xb].name[0] = 'S';
                                  pmVar3[0xb].name[1] = 'P';
                                  pmVar3[0xb].name[2] = 'I';
                                  pmVar3[0xb].name[3] = '_';
                                  pmVar3[0xb].name[4] = 'C';
                                  pmVar3[0xb].name[5] = 'L';
                                  pmVar3[0xb].name[6] = 'K';
                                  pmVar3[0xb].name[7] = '\0';
                                  *(undefined1 *)&pmVar3[0xb].capabilities = 0x11;
                                  pmVar3[0xb].capabilities.field_0x3 = 0;
                                  *(undefined2 *)&pmVar3[0xb].capabilities.field_0x1 = 0;
                                  pmVar3[0xb].spi.mux_total = 0;
                                  if (0xc < board->phy_pin_count) {
                                    pmVar3 = board->pins;
                                    pmVar3[0xc].name[0] = 'U';
                                    pmVar3[0xc].name[1] = 'A';
                                    pmVar3[0xc].name[2] = 'R';
                                    pmVar3[0xc].name[3] = 'T';
                                    pmVar3[0xc].name[4] = '1';
                                    pmVar3[0xc].name[5] = 'R';
                                    pmVar3[0xc].name[6] = 'T';
                                    pmVar3[0xc].name[7] = '\0';
                                    *(undefined1 *)&pmVar3[0xc].capabilities = 3;
                                    pmVar3[0xc].capabilities.field_0x3 = 0;
                                    *(undefined2 *)&pmVar3[0xc].capabilities.field_0x1 = 0;
                                    pmVar3[0xc].gpio.pinmap = iVar1 | 0xe2;
                                    pmVar3[0xc].gpio.mux_total = 0;
                                    pmVar3[0xc].gpio.gpio_chip = 0;
                                    pmVar3[0xc].gpio.gpio_line = 0x48;
                                    if (0xd < board->phy_pin_count) {
                                      pmVar3 = board->pins;
                                      pmVar3[0xd].name[0] = 'I';
                                      pmVar3[0xd].name[1] = '2';
                                      pmVar3[0xd].name[2] = 'C';
                                      pmVar3[0xd].name[3] = '_';
                                      pmVar3[0xd].name[4] = 'S';
                                      pmVar3[0xd].name[5] = 'C';
                                      pmVar3[0xd].name[6] = 'L';
                                      pmVar3[0xd].name[7] = '\0';
                                      *(undefined1 *)&pmVar3[0xd].capabilities = 0x21;
                                      pmVar3[0xd].capabilities.field_0x3 = 0;
                                      *(undefined2 *)&pmVar3[0xd].capabilities.field_0x1 = 0;
                                      pmVar3[0xd].i2c.pinmap = 1;
                                      pmVar3[0xd].i2c.mux_total = 0;
                                      if (0xe < board->phy_pin_count) {
                                        pmVar3 = board->pins;
                                        pmVar3[0xe].name[0] = 'I';
                                        pmVar3[0xe].name[1] = '2';
                                        pmVar3[0xe].name[2] = 'S';
                                        pmVar3[0xe].name[3] = '_';
                                        pmVar3[0xe].name[4] = 'C';
                                        pmVar3[0xe].name[5] = 'L';
                                        pmVar3[0xe].name[6] = 'K';
                                        pmVar3[0xe].name[7] = '\0';
                                        *(undefined1 *)&pmVar3[0xe].capabilities = 3;
                                        pmVar3[0xe].capabilities.field_0x3 = 0;
                                        *(undefined2 *)&pmVar3[0xe].capabilities.field_0x1 = 0;
                                        pmVar3[0xe].gpio.pinmap = iVar1 | 0xd8;
                                        pmVar3[0xe].gpio.mux_total = 0;
                                        pmVar3[0xe].gpio.gpio_chip = 0;
                                        pmVar3[0xe].gpio.gpio_line = 0x3e;
                                        if (0xf < board->phy_pin_count) {
                                          pmVar3 = board->pins;
                                          pmVar3[0xf].name[0] = 'I';
                                          pmVar3[0xf].name[1] = '2';
                                          pmVar3[0xf].name[2] = 'C';
                                          pmVar3[0xf].name[3] = '_';
                                          pmVar3[0xf].name[4] = 'S';
                                          pmVar3[0xf].name[5] = 'D';
                                          pmVar3[0xf].name[6] = 'A';
                                          pmVar3[0xf].name[7] = '\0';
                                          *(undefined1 *)&pmVar3[0xf].capabilities = 0x21;
                                          pmVar3[0xf].capabilities.field_0x3 = 0;
                                          *(undefined2 *)&pmVar3[0xf].capabilities.field_0x1 = 0;
                                          pmVar3[0xf].i2c.pinmap = 1;
                                          pmVar3[0xf].i2c.mux_total = 0;
                                          if (0x10 < board->phy_pin_count) {
                                            pmVar3 = board->pins;
                                            pmVar3[0x10].name[0] = 'I';
                                            pmVar3[0x10].name[1] = '2';
                                            pmVar3[0x10].name[2] = 'S';
                                            pmVar3[0x10].name[3] = '_';
                                            pmVar3[0x10].name[4] = 'F';
                                            pmVar3[0x10].name[5] = 'R';
                                            pmVar3[0x10].name[6] = 'M';
                                            pmVar3[0x10].name[7] = '\0';
                                            *(undefined1 *)&pmVar3[0x10].capabilities = 3;
                                            pmVar3[0x10].capabilities.field_0x3 = 0;
                                            *(undefined2 *)&pmVar3[0x10].capabilities.field_0x1 = 0;
                                            pmVar3[0x10].gpio.pinmap = iVar1 | 0xd9;
                                            pmVar3[0x10].gpio.mux_total = 0;
                                            pmVar3[0x10].gpio.gpio_chip = 0;
                                            pmVar3[0x10].gpio.gpio_line = 0x3f;
                                            if (0x11 < board->phy_pin_count) {
                                              pmVar3 = board->pins;
                                              pmVar3[0x11].name[0] = 'U';
                                              pmVar3[0x11].name[1] = 'A';
                                              pmVar3[0x11].name[2] = 'R';
                                              pmVar3[0x11].name[3] = 'T';
                                              pmVar3[0x11].name[4] = '2';
                                              pmVar3[0x11].name[5] = 'T';
                                              pmVar3[0x11].name[6] = 'X';
                                              pmVar3[0x11].name[7] = '\0';
                                              *(undefined1 *)&pmVar3[0x11].capabilities = 0x81;
                                              pmVar3[0x11].capabilities.field_0x3 = 0;
                                              *(undefined2 *)&pmVar3[0x11].capabilities.field_0x1 =
                                                   0;
                                              if (0x12 < board->phy_pin_count) {
                                                pmVar3 = board->pins;
                                                pmVar3[0x12].name[0] = 'I';
                                                pmVar3[0x12].name[1] = '2';
                                                pmVar3[0x12].name[2] = 'S';
                                                pmVar3[0x12].name[3] = '_';
                                                pmVar3[0x12].name[4] = 'D';
                                                pmVar3[0x12].name[5] = 'O';
                                                pmVar3[0x12].name[6] = '\0';
                                                pmVar3[0x12].name[7] = '\0';
                                                *(undefined1 *)&pmVar3[0x12].capabilities = 3;
                                                pmVar3[0x12].capabilities.field_0x3 = 0;
                                                *(undefined2 *)&pmVar3[0x12].capabilities.field_0x1
                                                     = 0;
                                                pmVar3[0x12].gpio.pinmap = iVar1 | 0xdb;
                                                pmVar3[0x12].gpio.mux_total = 0;
                                                pmVar3[0x12].gpio.gpio_chip = 0;
                                                pmVar3[0x12].gpio.gpio_line = 0x41;
                                                if (0x13 < board->phy_pin_count) {
                                                  pmVar3 = board->pins;
                                                  pmVar3[0x13].name[0] = 'U';
                                                  pmVar3[0x13].name[1] = 'A';
                                                  pmVar3[0x13].name[2] = 'R';
                                                  pmVar3[0x13].name[3] = 'T';
                                                  pmVar3[0x13].name[4] = '2';
                                                  pmVar3[0x13].name[5] = 'R';
                                                  pmVar3[0x13].name[6] = 'X';
                                                  pmVar3[0x13].name[7] = '\0';
                                                  *(undefined1 *)&pmVar3[0x13].capabilities = 0x81;
                                                  pmVar3[0x13].capabilities.field_0x3 = 0;
                                                  *(undefined2 *)
                                                   &pmVar3[0x13].capabilities.field_0x1 = 0;
                                                  if (0x14 < board->phy_pin_count) {
                                                    pmVar3 = board->pins;
                                                    pmVar3[0x14].name[0] = 'I';
                                                    pmVar3[0x14].name[1] = '2';
                                                    pmVar3[0x14].name[2] = 'S';
                                                    pmVar3[0x14].name[3] = '_';
                                                    pmVar3[0x14].name[4] = 'D';
                                                    pmVar3[0x14].name[5] = 'I';
                                                    pmVar3[0x14].name[6] = '\0';
                                                    pmVar3[0x14].name[7] = '\0';
                                                    *(undefined1 *)&pmVar3[0x14].capabilities = 3;
                                                    pmVar3[0x14].capabilities.field_0x3 = 0;
                                                    *(undefined2 *)
                                                     &pmVar3[0x14].capabilities.field_0x1 = 0;
                                                    pmVar3[0x14].gpio.pinmap = iVar1 | 0xda;
                                                    pmVar3[0x14].gpio.mux_total = 0;
                                                    pmVar3[0x14].gpio.gpio_chip = 0;
                                                    pmVar3[0x14].gpio.gpio_line = 0x40;
                                                    if (0x15 < board->phy_pin_count) {
                                                      pmVar3 = board->pins;
                                                      pmVar3[0x15].name[0] = 'S';
                                                      pmVar3[0x15].name[1] = '5';
                                                      pmVar3[0x15].name[2] = '_';
                                                      pmVar3[0x15].name[3] = '0';
                                                      pmVar3[0x15].name[4] = '\0';
                                                      pmVar3[0x15].name[5] = '\0';
                                                      pmVar3[0x15].name[6] = '\0';
                                                      pmVar3[0x15].name[7] = '\0';
                                                      *(undefined1 *)&pmVar3[0x15].capabilities = 3;
                                                      pmVar3[0x15].capabilities.field_0x3 = 0;
                                                      *(undefined2 *)
                                                       &pmVar3[0x15].capabilities.field_0x1 = 0;
                                                      pmVar3[0x15].gpio.pinmap = iVar1 | 0x52;
                                                      pmVar3[0x15].gpio.mux_total = 0;
                                                      pmVar3[0x15].gpio.gpio_chip = 2;
                                                      pmVar3[0x15].gpio.gpio_line = 0;
                                                    }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          mraa_intel_minnowboard_set_pininfo
                    (board,0x16,"PWM0",(mraa_pincapabilities_t)0x5,0xf8,0,0x5e);
          if (0x17 < board->phy_pin_count) {
            pmVar3 = board->pins;
            pmVar3[0x17].name[0] = 'S';
            pmVar3[0x17].name[1] = '5';
            pmVar3[0x17].name[2] = '_';
            pmVar3[0x17].name[3] = '1';
            pmVar3[0x17].name[4] = '\0';
            pmVar3[0x17].name[5] = '\0';
            pmVar3[0x17].name[6] = '\0';
            pmVar3[0x17].name[7] = '\0';
            *(undefined1 *)&pmVar3[0x17].capabilities = 3;
            pmVar3[0x17].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar3[0x17].capabilities.field_0x1 = 0;
            pmVar3[0x17].gpio.pinmap = arch_nr_gpios_adjust | 0x53;
            pmVar3[0x17].gpio.mux_total = 0;
            pmVar3[0x17].gpio.gpio_chip = 2;
            pmVar3[0x17].gpio.gpio_line = 1;
          }
          mraa_intel_minnowboard_set_pininfo
                    (board,0x18,"PWM1",(mraa_pincapabilities_t)0x5,0xf9,0,0x5f);
          if (0x19 < board->phy_pin_count) {
            pmVar3 = board->pins;
            pmVar3[0x19].name[0] = 'S';
            pmVar3[0x19].name[1] = '5';
            pmVar3[0x19].name[2] = '_';
            pmVar3[0x19].name[3] = '4';
            pmVar3[0x19].name[4] = '\0';
            pmVar3[0x19].name[5] = '\0';
            pmVar3[0x19].name[6] = '\0';
            pmVar3[0x19].name[7] = '\0';
            *(undefined1 *)&pmVar3[0x19].capabilities = 3;
            pmVar3[0x19].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar3[0x19].capabilities.field_0x1 = 0;
            pmVar3[0x19].gpio.pinmap = arch_nr_gpios_adjust | 0x54;
            pmVar3[0x19].gpio.mux_total = 0;
            pmVar3[0x19].gpio.gpio_chip = 2;
            pmVar3[0x19].gpio.gpio_line = 2;
          }
          if (turbot == 0) {
            if (0x1a < board->phy_pin_count) {
              pmVar3 = board->pins;
              pmVar3[0x1a].name[0] = 'I';
              pmVar3[0x1a].name[1] = 'B';
              pmVar3[0x1a].name[2] = 'L';
              pmVar3[0x1a].name[3] = '8';
              pmVar3[0x1a].name[4] = '2';
              pmVar3[0x1a].name[5] = '5';
              pmVar3[0x1a].name[6] = '4';
              pmVar3[0x1a].name[7] = '\0';
              *(undefined1 *)&pmVar3[0x1a].capabilities = 3;
              pmVar3[0x1a].capabilities.field_0x3 = 0;
              *(undefined2 *)&pmVar3[0x1a].capabilities.field_0x1 = 0;
              pmVar3[0x1a].gpio.pinmap = arch_nr_gpios_adjust | 0xd0;
              pmVar3[0x1a].gpio.mux_total = 0;
              pmVar3[0x1a].gpio.gpio_chip = 0;
              pmVar3[0x1a].gpio.gpio_line = 0x36;
            }
          }
          else if (0x1a < board->phy_pin_count) {
            pmVar3 = board->pins;
            pmVar3[0x1a].name[0] = 'I';
            pmVar3[0x1a].name[1] = '2';
            pmVar3[0x1a].name[2] = 'S';
            pmVar3[0x1a].name[3] = '_';
            pmVar3[0x1a].name[4] = 'M';
            pmVar3[0x1a].name[5] = 'C';
            pmVar3[0x1a].name[6] = 'L';
            pmVar3[0x1a].name[7] = 'K';
            *(undefined1 *)&pmVar3[0x1a].capabilities = 3;
            pmVar3[0x1a].capabilities.field_0x3 = 0;
            *(undefined2 *)&pmVar3[0x1a].capabilities.field_0x1 = 0;
            iVar1 = arch_nr_gpios_adjust;
            pmVar3[0x1a].gpio.pinmap = arch_nr_gpios_adjust | 0xfd;
            pmVar3[0x1a].gpio.mux_total = 0;
            pmVar3[0x1a].gpio.gpio_chip = 0;
            pmVar3[0x1a].gpio.gpio_line = 99;
            if (0x1b < board->phy_pin_count) {
              pmVar3 = board->pins;
              pmVar3[0x1b].name[0] = 'D';
              pmVar3[0x1b].name[1] = '2';
              pmVar3[0x1b].name[2] = '_';
              pmVar3[0x1b].name[3] = 'L';
              pmVar3[0x1b].name[4] = 'E';
              pmVar3[0x1b].name[5] = 'D';
              pmVar3[0x1b].name[6] = '\0';
              pmVar3[0x1b].name[7] = '\0';
              *(undefined1 *)&pmVar3[0x1b].capabilities = 3;
              pmVar3[0x1b].capabilities.field_0x3 = 0;
              *(undefined2 *)&pmVar3[0x1b].capabilities.field_0x1 = 0;
              pmVar3[0x1b].gpio.pinmap = iVar1 | 0x68;
              pmVar3[0x1b].gpio.mux_total = 0;
              pmVar3[0x1b].gpio.gpio_chip = 2;
              pmVar3[0x1b].gpio.gpio_line = 0x16;
            }
          }
          board->i2c_bus_count = 1;
          mVar2 = mraa_intel_minnowboard_get_pin_index(board,"I2C_SDA",&local_1ac);
          if ((mVar2 == MRAA_SUCCESS) &&
             (mVar2 = mraa_intel_minnowboard_get_pin_index(board,"I2C_SCL",&local_1b0),
             mVar2 == MRAA_SUCCESS)) {
            uVar6 = mraa_find_i2c_bus("designware",0);
            if (uVar6 == 0xffffffff) {
              board->i2c_bus_count = 0;
            }
            else {
              board->def_i2c_bus = uVar6;
              board->i2c_bus[0].bus_id = uVar6;
              board->i2c_bus[0].sda = local_1ac;
              board->i2c_bus[0].scl = local_1b0;
            }
          }
          board->pwm_default_period = 500;
          board->pwm_max_period = 1000000000;
          board->pwm_min_period = 1;
          board->spi_bus_count = 1;
          board->def_spi_bus = 0;
          board->spi_bus[0].bus_id = 0;
          board->spi_bus[0].slave_s = 0;
          board->spi_bus[0].sclk = 0xb;
          board->spi_bus[0].mosi = 9;
          board->spi_bus[0].miso = 7;
          board->spi_bus[0].cs = 5;
          board->uart_dev_count = 1;
          board->def_uart_dev = 0;
          board->uart_dev[0].rx = -1;
          board->uart_dev[0].tx = -1;
          board->uart_dev[0].device_path = "/dev/ttyS0";
          return board;
        }
        free(board->pins);
        pmVar3 = (mraa_pininfo_t *)board->adv_func;
      }
      free(pmVar3);
    }
    syslog(2,"minnowmax: Platform failed to initialise");
    free(board);
  }
  return (mraa_board_t *)0x0;
}

Assistant:

mraa_board_t*
mraa_intel_minnowboard_byt_compatible(mraa_boolean_t turbot)
{
    mraa_board_t* b = (mraa_board_t*) calloc(1, sizeof(mraa_board_t));

    struct utsname running_uname;
    int uname_major, uname_minor;

    if (b == NULL) {
        return NULL;
    }

    b->platform_name = PLATFORM_NAME;
    if (turbot) {
        b->platform_version = "Turbot";
        b->gpio_count = b->phy_pin_count = MRAA_INTEL_MINNOW_TURBOT_PINCOUNT;
    } else {
        b->platform_version = "Ax";
        b->gpio_count = b->phy_pin_count = MRAA_INTEL_MINNOW_MAX_PINCOUNT;
    }
    b->chardev_capable = 1;

    b->pins = (mraa_pininfo_t*) calloc((size_t) b->phy_pin_count, sizeof(mraa_pininfo_t));
    if (b->pins == NULL) {
        goto error;
    }

    b->adv_func = (mraa_adv_func_t*) calloc(1, sizeof(mraa_adv_func_t));
    if (b->adv_func == NULL) {
        free(b->pins);
        goto error;
    }

    if (uname(&running_uname) != 0) {
        free(b->pins);
        free(b->adv_func);
        goto error;
    }

    sscanf(running_uname.release, "%d.%d", &uname_major, &uname_minor);

    /* if we are on Linux 3.17 or lower they use a 256 max and number the GPIOs down
     * if we are on 3.18 or higher (ea584595fc85e65796335033dfca25ed655cd0ed)  (for now)
     * they start at 512 and number down, at some point this is going to change again when
     * GPIO moves to a radix.
     */
    if (uname_major <= 3 && uname_minor <= 17) {
        arch_nr_gpios_adjust = 0;
    }

    mraa_intel_minnowboard_set_pininfo(b, 0, "INVALID", (mraa_pincapabilities_t){ 0, 0, 0, 0, 0, 0, 0, 0 }, -1, -1, -1);
    mraa_intel_minnowboard_set_pininfo(b, 1, "GND", (mraa_pincapabilities_t){ 0, 0, 0, 0, 0, 0, 0, 0 }, -1, -1, -1);
    mraa_intel_minnowboard_set_pininfo(b, 2, "GND", (mraa_pincapabilities_t){ 0, 0, 0, 0, 0, 0, 0, 0 }, -1, -1, -1);
    mraa_intel_minnowboard_set_pininfo(b, 3, "5v", (mraa_pincapabilities_t){ 0, 0, 0, 0, 0, 0, 0, 0 }, -1, -1, -1);
    mraa_intel_minnowboard_set_pininfo(b, 4, "3.3v", (mraa_pincapabilities_t){ 0, 0, 0, 0, 0, 0, 0, 0 }, -1, -1, -1);
    mraa_intel_minnowboard_set_pininfo(b, 5, "SPI_CS", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, 220, 0, 66);
    mraa_intel_minnowboard_set_pininfo(b, 6, "UART1TX", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 1 }, 225, 0, 71);
    mraa_intel_minnowboard_set_pininfo(b, 7, "SPIMISO", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, 221, 0, 67);
    mraa_intel_minnowboard_set_pininfo(b, 8, "UART1RX", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 1 }, 224, 0, 70);
    mraa_intel_minnowboard_set_pininfo(b, 9, "SPIMOSI", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, 222, 0, 68);
    mraa_intel_minnowboard_set_pininfo(b, 10, "UART1CT", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 227, 0, 73);
    mraa_intel_minnowboard_set_pininfo(b, 11, "SPI_CLK", (mraa_pincapabilities_t){ 1, 0, 0, 0, 1, 0, 0, 0 }, 223, 0, 69);
    mraa_intel_minnowboard_set_pininfo(b, 12, "UART1RT", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 226, 0, 72);
    mraa_intel_minnowboard_set_pininfo(b, 13, "I2C_SCL", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 }, 243, 0, 89);
    mraa_intel_minnowboard_set_pininfo(b, 14, "I2S_CLK", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 216, 0, 62);
    mraa_intel_minnowboard_set_pininfo(b, 15, "I2C_SDA", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 }, 242, 0, 88);
    mraa_intel_minnowboard_set_pininfo(b, 16, "I2S_FRM", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 217, 0, 63);
    mraa_intel_minnowboard_set_pininfo(b, 17, "UART2TX", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 1 }, 229, 0, 75);
    mraa_intel_minnowboard_set_pininfo(b, 18, "I2S_DO", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 219, 0, 65);
    mraa_intel_minnowboard_set_pininfo(b, 19, "UART2RX", (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 1 }, 228, 0, 74);
    mraa_intel_minnowboard_set_pininfo(b, 20, "I2S_DI", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 218, 0, 64);
    mraa_intel_minnowboard_set_pininfo(b, 21, "S5_0", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 82, 2, 0);
    mraa_intel_minnowboard_set_pininfo(b, 22, "PWM0", (mraa_pincapabilities_t){ 1, 0, 1, 0, 0, 0, 0, 0 },
                     248, 0, 94); // Assume BIOS configured for PWM
    mraa_intel_minnowboard_set_pininfo(b, 23, "S5_1", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 83, 2, 1);
    mraa_intel_minnowboard_set_pininfo(b, 24, "PWM1", (mraa_pincapabilities_t){ 1, 0, 1, 0, 0, 0, 0, 0 },
                     249, 0, 95); // Assume BIOS configured for PWM
    mraa_intel_minnowboard_set_pininfo(b, 25, "S5_4", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 84, 2, 2);
    if (turbot) {
        mraa_intel_minnowboard_set_pininfo(b, 26, "I2S_MCLK", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 253, 0, 99);
        mraa_intel_minnowboard_set_pininfo(b, 27, "D2_LED", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 104, 2, 22);
    } else {
        mraa_intel_minnowboard_set_pininfo(b, 26, "IBL8254", (mraa_pincapabilities_t){ 1, 1, 0, 0, 0, 0, 0, 0 }, 208, 0, 54);
    }

    // Set number of i2c adaptors usable from userspace
    b->i2c_bus_count = 1;

    // Configure i2c adaptor #7 and make it the default
    int pin_index_sda, pin_index_scl;
    if (mraa_intel_minnowboard_get_pin_index(b, "I2C_SDA", &pin_index_sda) == MRAA_SUCCESS &&
        mraa_intel_minnowboard_get_pin_index(b, "I2C_SCL", &pin_index_scl) == MRAA_SUCCESS) {
        int bus = mraa_find_i2c_bus(I2CNAME, 0);
        if (bus == -1) {
            b->i2c_bus_count = 0;
        } else {
            b->def_i2c_bus = (unsigned int) bus;
            b->i2c_bus[0].bus_id = b->def_i2c_bus;
            b->i2c_bus[0].sda = pin_index_sda;
            b->i2c_bus[0].scl = pin_index_scl;
        }
    }

    // Configure PWM
    b->pwm_default_period = 500;
    b->pwm_max_period = 1000000000;
    b->pwm_min_period = 1;

    b->spi_bus_count = 1;
    b->def_spi_bus = 0;
    b->spi_bus[0].bus_id = 0;
    b->spi_bus[0].slave_s = 0;
    b->spi_bus[0].cs = 5;
    b->spi_bus[0].mosi = 9;
    b->spi_bus[0].miso = 7;
    b->spi_bus[0].sclk = 11;

    b->uart_dev_count = 1;
    b->def_uart_dev = 0;
    b->uart_dev[0].rx = -1;
    b->uart_dev[0].tx = -1;
    b->uart_dev[0].device_path = "/dev/ttyS0";

    return b;
error:
    syslog(LOG_CRIT, "minnowmax: Platform failed to initialise");
    free(b);
    return NULL;
}